

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O2

string * __thiscall
spvtools::val::(anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Instruction *inst)

{
  long lVar1;
  StorageClass operand;
  ostream *poVar2;
  char *pcVar3;
  Instruction *inst_00;
  string local_1c0;
  ostringstream ss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  GetIdDesc_abi_cxx11_(&local_1c0,(_anonymous_namespace_ *)inst,inst_00);
  poVar2 = std::operator<<((ostream *)&ss,(string *)&local_1c0);
  std::operator<<(poVar2," uses storage class ");
  std::__cxx11::string::_M_dispose();
  lVar1 = *this;
  operand = anon_unknown_0::GetStorageClass(inst);
  pcVar3 = AssemblyGrammar::lookupOperandName
                     ((AssemblyGrammar *)(lVar1 + 0x438),SPV_OPERAND_TYPE_STORAGE_CLASS,operand);
  std::operator<<((ostream *)&ss,pcVar3);
  std::operator<<((ostream *)&ss,".");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string BuiltInsValidator::GetStorageClassDesc(
    const Instruction& inst) const {
  std::ostringstream ss;
  ss << GetIdDesc(inst) << " uses storage class ";
  ss << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_STORAGE_CLASS,
                                      uint32_t(GetStorageClass(inst)));
  ss << ".";
  return ss.str();
}